

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

quaternion *
quaternion_cross_product_EXP(quaternion *__return_storage_ptr__,quaternion *self,quaternion *vT)

{
  quaternion *vT_local;
  quaternion *self_local;
  
  (__return_storage_ptr__->field_0).q[0] =
       (self->field_0).q[1] * (vT->field_0).q[2] + -((self->field_0).q[2] * (vT->field_0).q[1]);
  (__return_storage_ptr__->field_0).q[1] =
       (self->field_0).q[2] * (vT->field_0).q[0] + -((self->field_0).q[0] * (vT->field_0).q[2]);
  (__return_storage_ptr__->field_0).q[2] =
       (self->field_0).q[0] * (vT->field_0).q[1] + -((self->field_0).q[1] * (vT->field_0).q[0]);
  (__return_storage_ptr__->field_0).q[3] =
       -((self->field_0).q[2] * (vT->field_0).q[2] +
        (self->field_0).q[0] * (vT->field_0).q[0] + (self->field_0).q[1] * (vT->field_0).q[1]);
  return __return_storage_ptr__;
}

Assistant:

HYPAPI struct quaternion quaternion_cross_product_EXP(const struct quaternion *self, const struct quaternion *vT)
{
	/*
	 * The code is suspect (missing w element in this whole thing)
	 * It is computing a cross-product on the vector portion and a
	 * negative dot product on the real portion.
	 */
	struct quaternion r;

	r.x = (self->y * vT->z) - (self->z * vT->y);
	r.y = (self->z * vT->x) - (self->x * vT->z);
	r.z = (self->x * vT->y) - (self->y * vT->x);
	r.w = -((self->x * vT->x) + (self->y * vT->y) + (self->z * vT->z));

	return r;
}